

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

int __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SpaceUsedExcludingSelf<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Type *value;
  int local_28;
  int local_18;
  int local_14;
  int i;
  int allocated_bytes;
  RepeatedPtrFieldBase *this_local;
  
  if (this->elements_ == (void **)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = this->total_size_ << 3;
  }
  local_14 = local_28;
  for (local_18 = 0; local_18 < this->allocated_size_; local_18 = local_18 + 1) {
    value = cast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (this->elements_[local_18]);
    iVar1 = StringTypeHandler::SpaceUsed(value);
    local_14 = iVar1 + local_14;
  }
  return local_14;
}

Assistant:

inline int RepeatedPtrFieldBase::SpaceUsedExcludingSelf() const {
  int allocated_bytes =
      (elements_ != NULL) ? total_size_ * sizeof(elements_[0]) : 0;
  for (int i = 0; i < allocated_size_; ++i) {
    allocated_bytes += TypeHandler::SpaceUsed(*cast<TypeHandler>(elements_[i]));
  }
  return allocated_bytes;
}